

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

void __thiscall QMakeProject::dump(QMakeProject *this)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  ProString *v;
  ProString *val;
  QString *this_00;
  Data *__s;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b8;
  QStringBuilder<char,_QString> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  lVar4 = (long)(this->super_QMakeEvaluator).m_valuemapStack.
                super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                .
                super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
  if (lVar4 == 0) {
    p_Var2 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var2 = *(_Rb_tree_node_base **)(lVar4 + 0x20);
  }
  while( true ) {
    p_Var3 = (_Rb_tree_node_base *)(lVar4 + 0x10);
    if (lVar4 == 0) {
      p_Var3 = (_Rb_tree_node_base *)0x0;
    }
    if (p_Var2 == p_Var3) break;
    bVar1 = ProString::startsWith((ProString *)(p_Var2 + 1),(QChar)0x2e,CaseSensitive);
    if (!bVar1) {
      local_78.size = -0x5555555555555556;
      local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_78.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_98.b.d.d = (Data *)0x218a3d;
      local_98._0_8_ = (ProString *)(p_Var2 + 1);
      QStringBuilder<const_ProKey_&,_const_char_(&)[3]>::convertTo<QString>
                ((QString *)&local_78,(QStringBuilder<const_ProKey_&,_const_char_(&)[3]> *)&local_98
                );
      val = (ProString *)p_Var2[2]._M_right;
      for (lVar4 = *(long *)(p_Var2 + 3) * 0x30; lVar4 != 0; lVar4 = lVar4 + -0x30) {
        QMakeEvaluator::formatValue((QString *)&local_b8,val,false);
        local_98.b.d.size = local_b8.size;
        local_98.b.d.ptr = local_b8.ptr;
        local_98.b.d.d = local_b8.d;
        local_98.a = 0x20;
        local_b8.d = (Data *)0x0;
        local_b8.ptr = (char16_t *)0x0;
        local_b8.size = 0;
        ::operator+=((QString *)&local_78,&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98.b.d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        val = val + 1;
      }
      QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_58,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    lVar4 = (long)(this->super_QMakeEvaluator).m_valuemapStack.
                  super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  .
                  super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
  }
  QtPrivate::QStringList_sort((QList *)&local_58,CaseSensitive);
  this_00 = local_58.ptr;
  for (lVar4 = local_58.size * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
    QString::toLocal8Bit((QByteArray *)&local_98,this_00);
    __s = local_98.b.d.d;
    if (local_98.b.d.d == (Data *)0x0) {
      __s = (Data *)&QByteArray::_empty;
    }
    puts((char *)__s);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
    this_00 = this_00 + 1;
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeProject::dump() const
{
    QStringList out;
    for (ProValueMap::ConstIterator it = m_valuemapStack.front().begin();
         it != m_valuemapStack.front().end(); ++it) {
        if (!it.key().startsWith('.')) {
            QString str = it.key() + " =";
            for (const ProString &v : it.value())
                str += ' ' + formatValue(v);
            out << str;
        }
    }
    out.sort();
    for (const QString &v : std::as_const(out))
        puts(qPrintable(v));
}